

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4to16.h
# Opt level: O0

void ncnn::conv1x1s2_sgemm_pack4to16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  __m128 _v;
  int j;
  int i;
  float *outptr;
  float *r0;
  int p;
  Mat bottom_blob_shrinked;
  int tailstep;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int channels;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffffc50;
  size_t in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  Mat *in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  Mat *in_stack_fffffffffffffcc8;
  Mat *in_stack_fffffffffffffcd0;
  Mat *in_stack_fffffffffffffcd8;
  undefined4 uVar1;
  Mat *in_stack_fffffffffffffce0;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined4 local_2d0;
  long local_2c8;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined8 local_2a8;
  undefined8 *local_2a0;
  int local_298;
  void *local_288;
  int *local_280;
  long local_278;
  undefined4 local_270;
  long *local_268;
  undefined4 local_260;
  int local_25c;
  int local_258;
  undefined4 local_254;
  undefined4 local_250;
  long local_248;
  int local_240;
  int local_23c;
  int local_238;
  undefined4 local_234;
  long local_230;
  int local_228;
  int local_224;
  long *local_200;
  void **local_1f8;
  undefined8 *local_1f0;
  undefined1 *local_1e0;
  void **local_1d0;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  undefined1 *local_188;
  undefined8 *local_168;
  undefined1 local_15d;
  int local_15c;
  void **local_158;
  undefined1 *local_150;
  undefined1 *local_130;
  undefined8 *local_128;
  undefined1 local_11d;
  int local_11c;
  undefined8 *local_110;
  void *local_c0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  undefined8 *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_4c;
  long local_48;
  undefined8 *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_224 = *(int *)((long)in_RDI + 0x2c);
  local_228 = (int)in_RDI[7];
  local_230 = in_RDI[2];
  local_234 = (undefined4)in_RDI[3];
  local_238 = *(int *)(in_RSI + 0x2c);
  local_23c = *(int *)(in_RSI + 0x30);
  local_240 = (local_224 * 2 + local_238 * -2) * 4;
  local_1f8 = &local_288;
  local_288 = (void *)0x0;
  local_280 = (int *)0x0;
  local_278 = 0;
  local_270 = 0;
  local_268 = (long *)0x0;
  local_260 = 0;
  local_25c = 0;
  local_258 = 0;
  local_254 = 0;
  local_250 = 0;
  local_248 = 0;
  local_200 = in_RDI;
  Mat::create(in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
              (int)in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
              in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
              (Allocator *)in_stack_fffffffffffffcd0);
  for (local_298 = 0; local_298 < local_228; local_298 = local_298 + 1) {
    local_110 = &local_2e8;
    local_64 = *(int *)((long)local_200 + 0x2c);
    local_68 = (int)local_200[6];
    local_6c = *(undefined4 *)((long)local_200 + 0x34);
    local_78 = (undefined8 *)(*local_200 + local_200[8] * (long)local_298 * local_200[2]);
    local_80 = local_200[2];
    local_84 = (undefined4)local_200[3];
    local_90 = local_200[4];
    local_60 = &local_2e8;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_128 = &local_2e8;
    local_1f0 = &local_2e8;
    local_c = 0x10;
    local_11c = local_298;
    local_11d = 1;
    local_2e8 = 0;
    local_2d8 = 0;
    local_2d0 = 0;
    local_2c0 = 0;
    local_2bc = 0;
    local_2b8 = 0;
    local_2b4 = 0;
    local_2b0 = 0;
    local_2a8 = 0;
    local_2e0 = 0;
    local_150 = &stack0xfffffffffffffcc8;
    local_158 = &local_288;
    local_15c = local_298;
    local_2c = local_25c;
    local_30 = local_258;
    local_34 = local_254;
    local_40 = (undefined8 *)((long)local_288 + local_248 * local_298 * local_278);
    local_48 = local_278;
    local_4c = local_270;
    local_58 = local_268;
    local_28 = &stack0xfffffffffffffcc8;
    local_18 = (long)local_25c * (long)local_258 * local_278;
    local_1c = 0x10;
    local_15d = 1;
    local_130 = &stack0xfffffffffffffcc8;
    local_1e0 = &stack0xfffffffffffffcc8;
    in_stack_fffffffffffffcc8 = (Mat *)0x0;
    in_stack_fffffffffffffcd8 = (Mat *)0x0;
    uVar1 = 0;
    in_stack_fffffffffffffcd0 = (Mat *)0x0;
    local_2f0 = local_40;
    local_2a0 = local_78;
    for (in_stack_fffffffffffffcc4 = 0; in_stack_fffffffffffffcc4 < local_23c;
        in_stack_fffffffffffffcc4 = in_stack_fffffffffffffcc4 + 1) {
      for (in_stack_fffffffffffffcc0 = 0; in_stack_fffffffffffffcc0 < local_238;
          in_stack_fffffffffffffcc0 = in_stack_fffffffffffffcc0 + 1) {
        local_b0 = local_2a0;
        local_a8 = *local_2a0;
        uStack_a0 = local_2a0[1];
        local_98 = local_2f0;
        *local_2f0 = local_a8;
        local_2f0[1] = uStack_a0;
        local_2a0 = local_2a0 + 4;
        local_2f0 = local_2f0 + 2;
      }
      local_2a0 = (undefined8 *)((long)local_2a0 + (long)local_240 * 4);
    }
    local_188 = local_1e0;
    local_168 = local_1f0;
    local_2c8 = local_90;
  }
  conv1x1s1_sgemm_pack4to16_avx512
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
             in_stack_fffffffffffffcc8,
             (Option *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  local_1d0 = &local_288;
  if (local_280 != (int *)0x0) {
    local_1ac = 0xffffffff;
    LOCK();
    local_1b0 = *local_280;
    *local_280 = *local_280 + -1;
    UNLOCK();
    if (local_1b0 == 1) {
      local_1a8 = local_1d0;
      if (local_268 == (long *)0x0) {
        local_c0 = local_288;
        if (local_288 != (void *)0x0) {
          free(local_288);
        }
      }
      else {
        (**(code **)(*local_268 + 0x18))(local_268,local_288);
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack4to16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _v = _mm_load_ps(r0);
                _mm_store_ps(outptr, _v);

                r0 += 8;
                outptr += 4;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack4to16_avx512(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}